

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_receive(quicly_conn_t *conn,sockaddr *dest_addr,sockaddr *src_addr,
                  quicly_decoded_packet_t *packet)

{
  ptls_iovec_t src;
  ptls_iovec_t src_00;
  ptls_iovec_t vec;
  int iVar1;
  int iVar2;
  int iVar3;
  quicly_conn_t *pqVar4;
  uint8_t *puVar5;
  quicly_decoded_packet_t *in_RCX;
  ulong uVar6;
  short *in_RDX;
  short *in_RSI;
  quicly_conn_t *in_RDI;
  int retry_ok;
  ptls_aead_context_t *retry_aead;
  int ret;
  int is_ack_only;
  uint64_t offending_frame_type;
  uint64_t pn;
  ptls_iovec_t payload;
  size_t epoch;
  st_quicly_pn_space_t **space;
  anon_struct_16_2_74ab37f3 aead;
  ptls_cipher_context_t *header_protection;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  sockaddr *sa;
  quicly_address_t *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  quicly_conn_t *in_stack_ffffffffffffff48;
  uint64_t *in_stack_ffffffffffffff50;
  uint ack_epochs;
  quicly_conn_t *in_stack_ffffffffffffff58;
  quicly_decoded_packet_t *in_stack_ffffffffffffff60;
  quicly_conn_t *in_stack_ffffffffffffff68;
  _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  quicly_state_t qVar7;
  undefined4 in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  quicly_conn_t *local_60;
  int *local_58;
  uint64_t *local_50;
  quicly_conn_t *local_48;
  st_quicly_application_space_t **local_40;
  code *local_38;
  quicly_conn_t *local_30;
  ptls_cipher_context_t *local_28;
  quicly_decoded_packet_t *local_20;
  short *local_10;
  quicly_conn_t *local_8;
  
  if ((*in_RDX != 2) && (*in_RDX != 10)) {
    __assert_fail("src_addr->sa_family == AF_INET || src_addr->sa_family == AF_INET6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1604,
                  "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                 );
  }
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  lock_now((quicly_conn_t *)&in_stack_ffffffffffffff30->sa,in_stack_ffffffffffffff2c);
  iVar1 = is_stateless_reset(local_8,local_20);
  sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    (local_8->super).stats.num_bytes.received =
         (local_8->super).stats.num_bytes.received + local_20->datagram_size;
    qVar7 = (local_8->super).state;
    if (qVar7 == QUICLY_STATE_CLOSING) {
      (local_8->egress).connection_close.num_packets_received =
           (local_8->egress).connection_close.num_packets_received + 1;
      uVar6 = (local_8->egress).connection_close.num_packets_received;
      uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 & 0x3333333333333333) + (uVar6 >> 2 & 0x3333333333333333);
      if ((char)((uVar6 + (uVar6 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) == '\x01')
      {
        (local_8->egress).send_ack_at = 0;
      }
      iVar1 = 0;
    }
    else if (qVar7 == QUICLY_STATE_DRAINING) {
      iVar1 = 0;
      sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    }
    else {
      if ((*(local_20->octets).base & 0x80) == 0) {
        if ((local_8->application == (st_quicly_application_space_t *)0x0) ||
           (local_28 = (local_8->application->cipher).ingress.header_protection.one_rtt,
           local_28 == (ptls_cipher_context_t *)0x0)) {
          iVar1 = 0xff01;
          sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          goto LAB_0013d875;
        }
        local_38 = aead_decrypt_1rtt;
        local_30 = local_8;
        local_40 = &local_8->application;
        local_48 = (quicly_conn_t *)0x3;
      }
      else {
        if (((local_8->super).state == QUICLY_STATE_FIRSTFLIGHT) && (local_20->version == 0)) {
          iVar1 = handle_version_negotiation_packet
                            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
          goto LAB_0013d875;
        }
        if (local_20->version != (local_8->super).version) {
          iVar1 = 0xff01;
          sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          goto LAB_0013d875;
        }
        in_stack_ffffffffffffff7c = *(local_20->octets).base & 0xfffffff0;
        if (in_stack_ffffffffffffff7c == 0xc0) {
          if ((local_8->initial == (st_quicly_handshake_space_t *)0x0) ||
             (local_28 = (local_8->initial->cipher).ingress.header_protection,
             local_28 == (ptls_cipher_context_t *)0x0)) {
            iVar1 = 0xff01;
            sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
            goto LAB_0013d875;
          }
          iVar1 = quicly_is_client(local_8);
          if (iVar1 == 0) {
            if (local_20->datagram_size < 0x4b0) {
              iVar1 = 0xff01;
              sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
              goto LAB_0013d875;
            }
          }
          else if ((local_8->super).state == QUICLY_STATE_FIRSTFLIGHT) {
            src_00.base._4_4_ = in_stack_ffffffffffffff2c;
            src_00.base._0_4_ = in_stack_ffffffffffffff28;
            src_00.len = (size_t)in_stack_ffffffffffffff30;
            quicly_set_cid((quicly_cid_t *)0x13d137,src_00);
          }
          local_30 = (quicly_conn_t *)(local_8->initial->cipher).ingress.aead;
          local_40 = (st_quicly_application_space_t **)&local_8->initial;
          local_48 = (quicly_conn_t *)0x0;
        }
        else if (in_stack_ffffffffffffff7c == 0xd0) {
          iVar1 = quicly_is_client(local_8);
          if (iVar1 != 0) {
            iVar1 = 0xff01;
            sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
            goto LAB_0013d875;
          }
          if ((local_8->application == (st_quicly_application_space_t *)0x0) ||
             (local_28 = (local_8->application->cipher).ingress.header_protection.zero_rtt,
             local_28 == (ptls_cipher_context_t *)0x0)) {
            iVar1 = 0xff01;
            sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
            goto LAB_0013d875;
          }
          local_30 = (quicly_conn_t *)(local_8->application->cipher).ingress.aead[1];
          local_40 = &local_8->application;
          local_48 = (quicly_conn_t *)0x1;
        }
        else {
          if (in_stack_ffffffffffffff7c != 0xe0) {
            if (in_stack_ffffffffffffff7c == 0xf0) {
              if (local_20->encrypted_off + 0x10 != (local_20->octets).len) {
                __assert_fail("packet->encrypted_off + PTLS_AESGCM_TAG_SIZE == packet->octets.len",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                              ,0x1632,
                              "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                             );
              }
              iVar1 = quicly_is_client(local_8);
              ack_epochs = (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
              if (iVar1 == 0) {
                iVar1 = 0xff01;
                sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
              }
              else {
                vec.base._4_4_ = in_stack_ffffffffffffff3c;
                vec.base._0_4_ = in_stack_ffffffffffffff38;
                vec.len._0_4_ = in_stack_ffffffffffffff40;
                vec.len._4_4_ = in_stack_ffffffffffffff44;
                iVar1 = quicly_cid_is_equal((quicly_cid_t *)&in_stack_ffffffffffffff30->sa,vec);
                if (iVar1 == 0) {
                  iVar1 = is_retry(local_8);
                  if (iVar1 == 0) {
                    pqVar4 = (quicly_conn_t *)
                             create_retry_aead((quicly_context_t *)
                                               CONCAT44(in_stack_ffffffffffffff44,
                                                        in_stack_ffffffffffffff40),
                                               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
                    iVar1 = validate_retry_tag(local_20,&(local_8->super).remote.cid_set.cids[0].cid
                                               ,(ptls_aead_context_t *)pqVar4);
                    ptls_aead_free((ptls_aead_context_t *)0x13cf47);
                    if (iVar1 == 0) {
                      iVar1 = 0xff01;
                      sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                      ;
                    }
                    else if ((local_20->token).len < 0x201) {
                      free((local_8->token).base);
                      puVar5 = (uint8_t *)malloc((local_20->token).len);
                      (local_8->token).base = puVar5;
                      if (puVar5 == (uint8_t *)0x0) {
                        iVar1 = 0x201;
                        sa = (sockaddr *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
                      }
                      else {
                        memcpy((local_8->token).base,(local_20->token).base,(local_20->token).len);
                        (local_8->token).len = (local_20->token).len;
                        src.base._4_4_ = in_stack_ffffffffffffff2c;
                        src.base._0_4_ = in_stack_ffffffffffffff28;
                        src.len = (size_t)in_stack_ffffffffffffff30;
                        quicly_set_cid((quicly_cid_t *)0x13d030,src);
                        *(undefined8 *)(local_8->retry_scid).cid =
                             *(undefined8 *)(local_8->super).remote.cid_set.cids[0].cid.cid;
                        *(undefined8 *)((local_8->retry_scid).cid + 8) =
                             *(undefined8 *)((local_8->super).remote.cid_set.cids[0].cid.cid + 8);
                        *(undefined4 *)((local_8->retry_scid).cid + 0x10) =
                             *(undefined4 *)((local_8->super).remote.cid_set.cids[0].cid.cid + 0x10)
                        ;
                        (local_8->retry_scid).len = (local_8->super).remote.cid_set.cids[0].cid.len;
                        iVar1 = reinstall_initial_encryption(pqVar4,iVar1);
                        sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
                        if (iVar1 == 0) {
                          iVar1 = discard_sentmap_by_epoch(in_stack_ffffffffffffff58,ack_epochs);
                          sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
                        }
                      }
                    }
                    else {
                      iVar1 = 0xff01;
                      sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                      ;
                    }
                  }
                  else {
                    iVar1 = 0xff01;
                    sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
                  }
                }
                else {
                  iVar1 = 0xff01;
                  sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
                }
              }
            }
            else {
              iVar1 = 0xff01;
              sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
            }
            goto LAB_0013d875;
          }
          if ((local_8->handshake == (st_quicly_handshake_space_t *)0x0) ||
             (local_28 = (local_8->handshake->cipher).ingress.header_protection,
             local_28 == (ptls_cipher_context_t *)0x0)) {
            iVar1 = 0xff01;
            sa = (sockaddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
            goto LAB_0013d875;
          }
          local_30 = (quicly_conn_t *)(local_8->handshake->cipher).ingress.aead;
          local_40 = (st_quicly_application_space_t **)&local_8->handshake;
          local_48 = (quicly_conn_t *)0x2;
        }
        local_38 = aead_decrypt_fixed_key;
      }
      sa = (sockaddr *)&local_58;
      iVar1 = decrypt_packet((ptls_cipher_context_t *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             (uint64_t *)in_stack_ffffffffffffff60,
                             (quicly_decoded_packet_t *)in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff50,
                             (ptls_iovec_t *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar1 == 0) {
        iVar3 = (int)((ulong)(local_8->stash).now >> 0x20);
        pqVar4 = local_8;
        get_epoch('\0');
        QUICLY_TRACER_PACKET_RECEIVED
                  (pqVar4,(int64_t)in_stack_ffffffffffffff48,
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (size_t)in_stack_ffffffffffffff30,(uint8_t)((ulong)sa >> 0x38));
        if ((local_8->super).state == QUICLY_STATE_FIRSTFLIGHT) {
          (local_8->super).state = QUICLY_STATE_CONNECTED;
        }
        (local_8->super).stats.num_packets.received =
             (local_8->super).stats.num_packets.received + 1;
        in_stack_ffffffffffffff48 = local_48;
        if (local_48 == (quicly_conn_t *)0x0) {
          if ((ulong)local_8->initial->largest_ingress_udp_payload_size < local_20->datagram_size) {
            local_8->initial->largest_ingress_udp_payload_size = (uint16_t)local_20->datagram_size;
          }
        }
        else if ((local_48 == (quicly_conn_t *)0x2) &&
                (local_8->initial != (st_quicly_handshake_space_t *)0x0)) {
          iVar1 = discard_handshake_context
                            ((quicly_conn_t *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (size_t)in_stack_ffffffffffffff30);
          if (iVar1 != 0) goto LAB_0013d875;
          update_loss_alarm(local_60,iVar3);
          *(byte *)&(local_8->super).remote.address_validation =
               *(byte *)&(local_8->super).remote.address_validation & 0xfe | 1;
        }
        iVar1 = handle_payload((quicly_conn_t *)CONCAT44(in_stack_ffffffffffffff94,iVar1),
                               in_stack_ffffffffffffff88,
                               (uint8_t *)CONCAT44(in_stack_ffffffffffffff84,qVar7),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               local_50,local_58);
        if ((iVar1 == 0) &&
           (((*local_40 == (st_quicly_application_space_t *)0x0 ||
             (QUICLY_STATE_CONNECTED < (local_8->super).state)) ||
            (iVar1 = record_receipt((st_quicly_pn_space_t *)pqVar4,
                                    (uint64_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                    (int64_t *)in_stack_ffffffffffffff30), iVar1 == 0)))) {
          in_stack_ffffffffffffff44 = (int)((ulong)local_48 >> 0x20);
          if (local_48 == (quicly_conn_t *)0x0) {
            if (local_8->initial == (st_quicly_handshake_space_t *)0x0) {
              __assert_fail("conn->initial != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0x16ce,
                            "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                           );
            }
            iVar2 = quicly_is_client(local_8);
            if (((iVar2 != 0) && (local_8->handshake != (st_quicly_handshake_space_t *)0x0)) &&
               ((local_8->handshake->cipher).egress.aead != (ptls_aead_context_t *)0x0)) {
              iVar1 = discard_handshake_context
                                ((quicly_conn_t *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                 (size_t)in_stack_ffffffffffffff30);
              if (iVar1 != 0) goto LAB_0013d875;
              update_loss_alarm(local_60,iVar3);
            }
          }
          else if (local_48 == (quicly_conn_t *)0x2) {
            iVar2 = quicly_is_client(local_8);
            if (iVar2 == 0) {
              iVar2 = ptls_handshake_is_complete((local_8->crypto).tls);
              if (iVar2 != 0) {
                iVar1 = discard_handshake_context
                                  ((quicly_conn_t *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (size_t)in_stack_ffffffffffffff30);
                if (iVar1 != 0) goto LAB_0013d875;
                if (local_8->handshake != (st_quicly_handshake_space_t *)0x0) {
                  __assert_fail("conn->handshake == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                                ,0x16e2,
                                "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                               );
                }
                (local_8->egress).pending_flows = (local_8->egress).pending_flows | 0x40;
                update_loss_alarm(local_60,iVar3);
              }
            }
            else if ((((local_8->super).local.address.sa.sa_family == 0) &&
                     (local_10 != (short *)0x0)) &&
                    ((*local_10 != 0 &&
                     ((iVar3 = ptls_handshake_is_complete((local_8->crypto).tls), iVar3 != 0 &&
                      (((local_8->super).remote.transport_params.field_0x50 & 1) != 0)))))) {
              set_address(in_stack_ffffffffffffff30,sa);
            }
          }
          else if (((local_48 == (quicly_conn_t *)0x3) && (in_stack_ffffffffffffff94 == 0)) &&
                  (iVar3 = should_send_max_data((quicly_conn_t *)0x13d847), iVar3 != 0)) {
            (local_8->egress).send_ack_at = 0;
          }
          update_idle_timeout(pqVar4,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        }
      }
      else {
        (local_8->super).stats.num_packets.decryption_failed =
             (local_8->super).stats.num_packets.decryption_failed + 1;
        QUICLY_TRACER_PACKET_DECRYPTION_FAILED
                  ((st_quicly_conn_t *)&in_stack_ffffffffffffff30->sa,(int64_t)sa,0x13d405);
      }
    }
  }
  else {
    iVar1 = handle_stateless_reset
                      ((quicly_conn_t *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    sa = (sockaddr *)((ulong)in_stack_ffffffffffffff2c << 0x20);
  }
LAB_0013d875:
  if (iVar1 == 0) {
    if ((local_8->egress).loss.alarm_at < (local_8->stash).now) {
      (local_8->egress).loss.alarm_at = (local_8->stash).now;
    }
    assert_consistency((quicly_conn_t *)&in_stack_ffffffffffffff30->sa,(int)((ulong)sa >> 0x20));
  }
  else if (((iVar1 != 0x201) && (iVar1 != 0xff01)) && (iVar1 != 0xff07)) {
    initiate_close(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                   CONCAT44(iVar1,in_stack_ffffffffffffff38),(char *)in_stack_ffffffffffffff30);
    iVar1 = 0;
  }
  unlock_now((quicly_conn_t *)0x13d92d);
  return iVar1;
}

Assistant:

int quicly_receive(quicly_conn_t *conn, struct sockaddr *dest_addr, struct sockaddr *src_addr, quicly_decoded_packet_t *packet)
{
    ptls_cipher_context_t *header_protection;
    struct {
        int (*cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *);
        void *ctx;
    } aead;
    struct st_quicly_pn_space_t **space;
    size_t epoch;
    ptls_iovec_t payload;
    uint64_t pn, offending_frame_type = QUICLY_FRAME_TYPE_PADDING;
    int is_ack_only, ret;

    assert(src_addr->sa_family == AF_INET || src_addr->sa_family == AF_INET6);

    lock_now(conn, 0);

    QUICLY_PROBE(RECEIVE, conn, conn->stash.now,
                 QUICLY_PROBE_HEXDUMP(packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len), packet->octets.base,
                 packet->octets.len);

    if (is_stateless_reset(conn, packet)) {
        ret = handle_stateless_reset(conn);
        goto Exit;
    }

    /* FIXME check peer address */

    /* add unconditionally, as packet->datagram_size is set only for the first packet within the UDP datagram */
    conn->super.stats.num_bytes.received += packet->datagram_size;

    switch (conn->super.state) {
    case QUICLY_STATE_CLOSING:
        ++conn->egress.connection_close.num_packets_received;
        /* respond with a CONNECTION_CLOSE frame using exponential back-off */
        if (__builtin_popcountl(conn->egress.connection_close.num_packets_received) == 1)
            conn->egress.send_ack_at = 0;
        ret = 0;
        goto Exit;
    case QUICLY_STATE_DRAINING:
        ret = 0;
        goto Exit;
    default:
        break;
    }

    if (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0])) {
        if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT) {
            if (packet->version == 0) {
                ret = handle_version_negotiation_packet(conn, packet);
                goto Exit;
            }
        }
        if (packet->version != conn->super.version) {
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
        switch (packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) {
        case QUICLY_PACKET_TYPE_RETRY: {
            assert(packet->encrypted_off + PTLS_AESGCM_TAG_SIZE == packet->octets.len);
            /* handle only if the connection is the client */
            if (!quicly_is_client(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* server CID has to change */
            if (quicly_cid_is_equal(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* do not accept a second Retry */
            if (is_retry(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            ptls_aead_context_t *retry_aead = create_retry_aead(conn->super.ctx, conn->super.version, 0);
            int retry_ok = validate_retry_tag(packet, &conn->super.remote.cid_set.cids[0].cid, retry_aead);
            ptls_aead_free(retry_aead);
            if (!retry_ok) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* check size of the Retry packet */
            if (packet->token.len > QUICLY_MAX_TOKEN_LEN) {
                ret = QUICLY_ERROR_PACKET_IGNORED; /* TODO this is a immediate fatal error, chose a better error code */
                goto Exit;
            }
            /* store token and ODCID */
            free(conn->token.base);
            if ((conn->token.base = malloc(packet->token.len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(conn->token.base, packet->token.base, packet->token.len);
            conn->token.len = packet->token.len;
            /* update DCID */
            quicly_set_cid(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src);
            conn->retry_scid = conn->super.remote.cid_set.cids[0].cid;
            /* replace initial keys, or drop the keys if this is a response packet to a greased version */
            if ((ret = reinstall_initial_encryption(conn, QUICLY_ERROR_PACKET_IGNORED)) != 0)
                goto Exit;
            /* schedule retransmit */
            ret = discard_sentmap_by_epoch(conn, ~0u);
            goto Exit;
        } break;
        case QUICLY_PACKET_TYPE_INITIAL:
            if (conn->initial == NULL || (header_protection = conn->initial->cipher.ingress.header_protection) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            if (quicly_is_client(conn)) {
                /* client: update cid if this is the first Initial packet that's being received */
                if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT)
                    quicly_set_cid(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src);
            } else {
                /* server: ignore packets that are too small */
                if (packet->datagram_size < QUICLY_MIN_CLIENT_INITIAL_SIZE) {
                    ret = QUICLY_ERROR_PACKET_IGNORED;
                    goto Exit;
                }
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->initial->cipher.ingress.aead;
            space = (void *)&conn->initial;
            epoch = QUICLY_EPOCH_INITIAL;
            break;
        case QUICLY_PACKET_TYPE_HANDSHAKE:
            if (conn->handshake == NULL || (header_protection = conn->handshake->cipher.ingress.header_protection) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->handshake->cipher.ingress.aead;
            space = (void *)&conn->handshake;
            epoch = QUICLY_EPOCH_HANDSHAKE;
            break;
        case QUICLY_PACKET_TYPE_0RTT:
            if (quicly_is_client(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            if (conn->application == NULL ||
                (header_protection = conn->application->cipher.ingress.header_protection.zero_rtt) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->application->cipher.ingress.aead[1];
            space = (void *)&conn->application;
            epoch = QUICLY_EPOCH_0RTT;
            break;
        default:
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
    } else {
        /* short header packet */
        if (conn->application == NULL ||
            (header_protection = conn->application->cipher.ingress.header_protection.one_rtt) == NULL) {
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
        aead.cb = aead_decrypt_1rtt;
        aead.ctx = conn;
        space = (void *)&conn->application;
        epoch = QUICLY_EPOCH_1RTT;
    }

    /* decrypt */
    if ((ret = decrypt_packet(header_protection, aead.cb, aead.ctx, &(*space)->next_expected_packet_number, packet, &pn,
                              &payload)) != 0) {
        ++conn->super.stats.num_packets.decryption_failed;
        QUICLY_PROBE(PACKET_DECRYPTION_FAILED, conn, conn->stash.now, pn);
        goto Exit;
    }

    QUICLY_PROBE(PACKET_RECEIVED, conn, conn->stash.now, pn, payload.base, payload.len, get_epoch(packet->octets.base[0]));

    /* update states */
    if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT)
        conn->super.state = QUICLY_STATE_CONNECTED;
    conn->super.stats.num_packets.received += 1;

    /* state updates, that are triggered by the receipt of a packet */
    switch (epoch) {
    case QUICLY_EPOCH_INITIAL:
        /* update max_ingress_udp_payload_size if necessary */
        if (conn->initial->largest_ingress_udp_payload_size < packet->datagram_size)
            conn->initial->largest_ingress_udp_payload_size = packet->datagram_size;
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        /* Discard Initial space before processing the payload of the Handshake packet to avoid the chance of an ACK frame included
         * in the Handshake packet setting a loss timer for the Initial packet. */
        if (conn->initial != NULL) {
            if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_INITIAL)) != 0)
                goto Exit;
            update_loss_alarm(conn, 0);
            conn->super.remote.address_validation.validated = 1;
        }
        break;
    default:
        break;
    }

    /* handle the payload */
    if ((ret = handle_payload(conn, epoch, payload.base, payload.len, &offending_frame_type, &is_ack_only)) != 0)
        goto Exit;
    if (*space != NULL && conn->super.state < QUICLY_STATE_CLOSING) {
        if ((ret = record_receipt(*space, pn, is_ack_only, conn->stash.now, &conn->egress.send_ack_at)) != 0)
            goto Exit;
    }

    /* state updates post payload processing */
    switch (epoch) {
    case QUICLY_EPOCH_INITIAL:
        assert(conn->initial != NULL);
        if (quicly_is_client(conn) && conn->handshake != NULL && conn->handshake->cipher.egress.aead != NULL) {
            if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_INITIAL)) != 0)
                goto Exit;
            update_loss_alarm(conn, 0);
        }
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (quicly_is_client(conn)) {
            /* Running as a client.
             * Respect "disable_migration" TP sent by the remote peer at the end of the TLS handshake. */
            if (conn->super.local.address.sa.sa_family == AF_UNSPEC && dest_addr != NULL && dest_addr->sa_family != AF_UNSPEC &&
                ptls_handshake_is_complete(conn->crypto.tls) && conn->super.remote.transport_params.disable_active_migration)
                set_address(&conn->super.local.address, dest_addr);
        } else {
            /* Running as a server.
             * If handshake was just completed, drop handshake context, schedule the first emission of HANDSHAKE_DONE frame. */
            if (ptls_handshake_is_complete(conn->crypto.tls)) {
                if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
                    goto Exit;
                assert(conn->handshake == NULL);
                conn->egress.pending_flows |= QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
                update_loss_alarm(conn, 0);
            }
        }
        break;
    case QUICLY_EPOCH_1RTT:
        if (!is_ack_only && should_send_max_data(conn))
            conn->egress.send_ack_at = 0;
        break;
    default:
        break;
    }

    update_idle_timeout(conn, 1);

Exit:
    switch (ret) {
    case 0:
        /* Avoid time in the past being emitted by quicly_get_first_timeout. We hit the condition below when retransmission is
         * suspended by the 3x limit (in which case we have loss.alarm_at set but return INT64_MAX from quicly_get_first_timeout
         * until we receive something from the client).
         */
        if (conn->egress.loss.alarm_at < conn->stash.now)
            conn->egress.loss.alarm_at = conn->stash.now;
        assert_consistency(conn, 0);
        break;
    case PTLS_ERROR_NO_MEMORY:
    case QUICLY_ERROR_STATE_EXHAUSTION:
    case QUICLY_ERROR_PACKET_IGNORED:
        break;
    default: /* close connection */
        initiate_close(conn, ret, offending_frame_type, "");
        ret = 0;
        break;
    }
    unlock_now(conn);
    return ret;
}